

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

CharClass * __thiscall re2::CharClass::Negate(CharClass *this)

{
  iterator pRVar1;
  iterator pRVar2;
  CharClass *in_RDI;
  iterator it;
  int nextlo;
  int n;
  CharClass *cc;
  undefined8 in_stack_ffffffffffffffc0;
  RuneRange local_30;
  RuneRange local_28;
  iterator local_20;
  int local_18;
  int local_14;
  CharClass *local_10;
  
  local_10 = New((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  *local_10 = (CharClass)((byte)*in_RDI & 1);
  *(int *)(local_10 + 4) = 0x110000 - *(int *)(in_RDI + 4);
  local_14 = 0;
  local_18 = 0;
  local_20 = begin(in_RDI);
  while( true ) {
    pRVar1 = local_20;
    pRVar2 = end(in_RDI);
    if (pRVar1 == pRVar2) break;
    if (local_20->lo == local_18) {
      local_18 = local_20->hi;
    }
    else {
      RuneRange::RuneRange(&local_28,local_18,local_20->lo + -1);
      *(RuneRange *)(*(long *)(local_10 + 8) + (long)local_14 * 8) = local_28;
      local_18 = local_20->hi;
      local_14 = local_14 + 1;
    }
    local_18 = local_18 + 1;
    local_20 = local_20 + 1;
  }
  if (local_18 < 0x110000) {
    RuneRange::RuneRange(&local_30,local_18,0x10ffff);
    *(RuneRange *)(*(long *)(local_10 + 8) + (long)local_14 * 8) = local_30;
    local_14 = local_14 + 1;
  }
  *(int *)(local_10 + 0x10) = local_14;
  return local_10;
}

Assistant:

CharClass* CharClass::Negate() {
  CharClass* cc = CharClass::New(nranges_+1);
  cc->folds_ascii_ = folds_ascii_;
  cc->nrunes_ = Runemax + 1 - nrunes_;
  int n = 0;
  int nextlo = 0;
  for (CharClass::iterator it = begin(); it != end(); ++it) {
    if (it->lo == nextlo) {
      nextlo = it->hi + 1;
    } else {
      cc->ranges_[n++] = RuneRange(nextlo, it->lo - 1);
      nextlo = it->hi + 1;
    }
  }
  if (nextlo <= Runemax)
    cc->ranges_[n++] = RuneRange(nextlo, Runemax);
  cc->nranges_ = n;
  return cc;
}